

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ConfigureXmlOutput(UnitTestImpl *this)

{
  int iVar1;
  ostream *poVar2;
  XmlUnitTestResultPrinter *this_00;
  JsonUnitTestResultPrinter *this_01;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  long local_30;
  long local_28 [2];
  
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar1 == 0) {
    this_00 = (XmlUnitTestResultPrinter *)operator_new(0x28);
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(this_00,(char *)local_58[0]);
    TestEventListeners::SetDefaultXmlGenerator(&this->listeners_,(TestEventListener *)this_00);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar1 != 0) {
      if (local_30 != 0) {
        GTestLog::GTestLog((GTestLog *)local_58,GTEST_WARNING,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/build_O3/_deps/googletest-src/googletest/src/gtest.cc"
                           ,0x1606);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"WARNING: unrecognized output format \"",0x25);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_38,local_30);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ignored.",10);
        GTestLog::~GTestLog((GTestLog *)local_58);
      }
      goto LAB_001295c1;
    }
    this_01 = (JsonUnitTestResultPrinter *)operator_new(0x28);
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    JsonUnitTestResultPrinter::JsonUnitTestResultPrinter(this_01,(char *)local_58[0]);
    TestEventListeners::SetDefaultXmlGenerator(&this->listeners_,(TestEventListener *)this_01);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
LAB_001295c1:
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void UnitTestImpl::ConfigureXmlOutput() {
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
#if GTEST_HAS_FILE_SYSTEM
  if (output_format == "xml") {
    listeners()->SetDefaultXmlGenerator(new XmlUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format == "json") {
    listeners()->SetDefaultXmlGenerator(new JsonUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (!output_format.empty()) {
    GTEST_LOG_(WARNING) << "WARNING: unrecognized output format \""
                        << output_format << "\" ignored.";
  }
#else
  if (!output_format.empty()) {
    GTEST_LOG_(ERROR) << "ERROR: alternative output formats require "
                      << "GTEST_HAS_FILE_SYSTEM to be enabled";
  }
#endif  // GTEST_HAS_FILE_SYSTEM
}